

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteExports(CWriter *this,CWriterPhase kind)

{
  bool bVar1;
  Index IVar2;
  vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *this_00;
  reference ppEVar3;
  const_reference ppMVar4;
  mapped_type *name;
  uint *in_RCX;
  string_view sVar5;
  undefined1 auVar6 [16];
  Newline local_1d1;
  TagSymbol local_1d0;
  Newline local_1bb;
  CloseBrace local_1ba;
  Newline local_1b9;
  ExternalInstancePtr local_1b8;
  Newline local_1a3;
  CloseBrace local_1a2;
  Newline local_1a1;
  ExternalInstancePtr local_1a0;
  Newline local_18b;
  CloseBrace local_18a;
  Newline local_189;
  ExternalInstancePtr local_188;
  Newline local_173;
  CloseBrace local_172;
  Newline local_171;
  string_view local_170;
  GlobalName local_160;
  ExternalRef local_150;
  Type local_140;
  Index local_138;
  Index num_results;
  undefined4 local_120;
  Newline local_119;
  string_view local_118;
  Tag *local_108;
  Tag *tag;
  Table *table;
  Memory *memory;
  Global *global;
  Func *func;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_to_name;
  string internal_name;
  undefined1 local_98 [8];
  string mangled_name;
  string local_60;
  Newline local_39;
  Export *local_38;
  Export *export_;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *__range2;
  CWriterPhase kind_local;
  CWriter *this_local;
  
  bVar1 = std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::empty
                    (&this->module_->exports);
  if (!bVar1) {
    this_00 = &this->module_->exports;
    __end2 = std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::begin(this_00);
    export_ = (Export *)std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                                       *)&export_), bVar1) {
      ppEVar3 = __gnu_cxx::
                __normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                ::operator*(&__end2);
      local_38 = *ppEVar3;
      auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      sVar5._M_len = auVar6._8_8_;
      sVar5._M_str = (char *)in_RCX;
      (anonymous_namespace)::SanitizeForComment_abi_cxx11_(&local_60,auVar6._0_8_,sVar5);
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::Newline,char_const(&)[13],std::__cxx11::string,char_const(&)[5],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,&local_39,(char (*) [13])"/* export: \'",&local_60,
                 (char (*) [5])"\' */",(Newline *)(mangled_name.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_60);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                ((string *)local_98,(CWriter *)this,sVar5);
      std::__cxx11::string::string
                ((string *)
                 &index_to_name.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&func);
      in_RCX = &switchD_001d01a8::switchdataD_00235ed4;
      switch(local_38->kind) {
      case First:
        global = (Global *)Module::GetFunc(this->module_,&local_38->var);
        std::__cxx11::string::operator=
                  ((string *)
                   &index_to_name.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)global);
        if (kind == Declarations) {
          WriteFuncDeclaration(this,(FuncDeclaration *)&global->type,(string *)local_98);
        }
        else {
          this->func_ = (Func *)global;
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&this->local_syms_,&this->global_syms_);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&this->local_sym_map_);
          std::
          map<std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&this->stack_var_sym_map_);
          (anonymous_namespace)::CWriter::
          Write<std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
                    ((CWriter *)this,&(this->func_->decl).sig.result_types,(char (*) [2])0x234f67,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     (char (*) [2])0x239ca8);
          IVar2 = Func::GetNumParamsAndLocals(this->func_);
          in_RCX = (uint *)(ulong)IVar2;
          MakeTypeBindingReverseMapping
                    ((ulong)IVar2,&this->func_->bindings,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&func);
          WriteParams(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&func,false);
        }
        break;
      case Table:
        tag = (Tag *)Module::GetTable(this->module_,&local_38->var);
        std::__cxx11::string::operator=
                  ((string *)
                   &index_to_name.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)tag);
        WriteTablePtr(this,(string *)local_98,(Table *)tag);
        break;
      case Memory:
        table = (Table *)Module::GetMemory(this->module_,&local_38->var);
        std::__cxx11::string::operator=
                  ((string *)
                   &index_to_name.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)table);
        WriteMemoryPtr(this,(string *)local_98,(Memory *)table);
        break;
      case Global:
        memory = (Memory *)Module::GetGlobal(this->module_,&local_38->var);
        std::__cxx11::string::operator=
                  ((string *)
                   &index_to_name.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)memory);
        WriteGlobalPtr(this,(Global *)memory,(string *)local_98);
        break;
      case Last:
        local_108 = Module::GetTag(this->module_,&local_38->var);
        std::__cxx11::string::operator=
                  ((string *)
                   &index_to_name.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_108);
        if (kind == Declarations) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_118,"extern ");
          Write(this,local_118);
        }
        (anonymous_namespace)::CWriter::Write<char_const(&)[21],std::__cxx11::string_const&>
                  ((CWriter *)this,(char (*) [21])0x2387c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
        break;
      default:
        abort();
      }
      if (kind == Declarations) {
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [2])0x238bef,&local_119);
        local_120 = 3;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&num_results," ");
        Write(this,_num_results);
        in_RCX = &switchD_001d04d4::switchdataD_00235ee8;
        switch(local_38->kind) {
        case First:
          Write(this);
          bVar1 = IsSingleUnsharedMemory(this);
          if (bVar1) {
            ppMVar4 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::operator[]
                                (&this->module_->memories,0);
            InstallSegueBase(this,*ppMVar4,true);
          }
          local_138 = Func::GetNumResults(this->func_);
          if (local_138 < 2) {
            if (local_138 == 1) {
              local_140 = Func::GetResultType(this->func_,0);
              (anonymous_namespace)::CWriter::Write<wabt::Type,char_const(&)[8]>
                        ((CWriter *)this,&local_140,(char (*) [8])" ret = ");
            }
          }
          else {
            (anonymous_namespace)::CWriter::
            Write<std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[8]>
                      ((CWriter *)this,&(this->func_->decl).sig.result_types,(char (*) [8])" ret = "
                      );
          }
          ExternalRef::GlobalName
                    (&local_150,Func,
                     (string *)
                     &index_to_name.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::ExternalRef,char_const(&)[2]>
                    ((CWriter *)this,&local_150,(char (*) [2])0x239ca8);
          bVar1 = IsImport(this,(string *)
                                &index_to_name.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            name = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->import_module_sym_map_,
                                (key_type *)
                                &index_to_name.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            GlobalName::GlobalName(&local_160,Import,name);
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[11],wabt::(anonymous_namespace)::GlobalName>
                      ((CWriter *)this,(char (*) [11])0x239e24,&local_160);
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_170,"instance");
            Write(this,local_170);
          }
          WriteParamSymbols(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&func);
          bVar1 = IsSingleUnsharedMemory(this);
          if (bVar1) {
            RestoreSegueBase(this);
          }
          if (local_138 != 0) {
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[12],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [12])"return ret;",&local_171);
          }
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,&local_172,&local_173);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&this->local_sym_map_);
          std::
          map<std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&this->stack_var_sym_map_);
          this->func_ = (Func *)0x0;
          break;
        case Table:
          Write(this);
          ExternalInstancePtr::GlobalName
                    (&local_1b8,Table,
                     (string *)
                     &index_to_name.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          in_RCX = (uint *)0x238bef;
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[8],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [8])"return ",&local_1b8,(char (*) [2])0x238bef,
                     &local_1b9);
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,&local_1ba,&local_1bb);
          break;
        case Memory:
          Write(this);
          ExternalInstancePtr::GlobalName
                    (&local_1a0,Memory,
                     (string *)
                     &index_to_name.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          in_RCX = (uint *)0x238bef;
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[8],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [8])"return ",&local_1a0,(char (*) [2])0x238bef,
                     &local_1a1);
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,&local_1a2,&local_1a3);
          break;
        case Global:
          Write(this);
          ExternalInstancePtr::GlobalName
                    (&local_188,Global,
                     (string *)
                     &index_to_name.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          in_RCX = (uint *)0x238bef;
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[8],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [8])"return ",&local_188,(char (*) [2])0x238bef,
                     &local_189);
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,&local_18a,&local_18b);
          break;
        case Last:
          TagSymbol::TagSymbol
                    (&local_1d0,
                     (string *)
                     &index_to_name.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          in_RCX = (uint *)0x238bef;
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[3],wabt::(anonymous_namespace)::TagSymbol,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [3])0x239348,&local_1d0,(char (*) [2])0x238bef,
                     &local_1d1);
          break;
        default:
          abort();
        }
        local_120 = 0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&func);
      std::__cxx11::string::~string
                ((string *)
                 &index_to_name.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_98);
      __gnu_cxx::
      __normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void CWriter::WriteExports(CWriterPhase kind) {
  if (module_->exports.empty())
    return;

  for (const Export* export_ : module_->exports) {
    Write(Newline(), "/* export: '", SanitizeForComment(export_->name), "' */",
          Newline());

    const std::string mangled_name = ExportName(export_->name);
    std::string internal_name;
    std::vector<std::string> index_to_name;

    switch (export_->kind) {
      case ExternalKind::Func: {
        const Func* func = module_->GetFunc(export_->var);
        internal_name = func->name;
        if (kind == CWriterPhase::Declarations) {
          WriteFuncDeclaration(func->decl, mangled_name);
        } else {
          func_ = func;
          local_syms_ = global_syms_;
          local_sym_map_.clear();
          stack_var_sym_map_.clear();
          Write(func_->decl.sig.result_types, " ", mangled_name, "(");
          MakeTypeBindingReverseMapping(func_->GetNumParamsAndLocals(),
                                        func_->bindings, &index_to_name);
          WriteParams(index_to_name);
        }
        break;
      }

      case ExternalKind::Global: {
        const Global* global = module_->GetGlobal(export_->var);
        internal_name = global->name;
        WriteGlobalPtr(*global, mangled_name);
        break;
      }

      case ExternalKind::Memory: {
        const Memory* memory = module_->GetMemory(export_->var);
        internal_name = memory->name;
        WriteMemoryPtr(mangled_name, *memory);
        break;
      }

      case ExternalKind::Table: {
        const Table* table = module_->GetTable(export_->var);
        internal_name = table->name;
        WriteTablePtr(mangled_name, *table);
        break;
      }

      case ExternalKind::Tag: {
        const Tag* tag = module_->GetTag(export_->var);
        internal_name = tag->name;
        if (kind == CWriterPhase::Declarations) {
          Write("extern ");
        }
        Write("const wasm_rt_tag_t ", mangled_name);
        break;
      }

      default:
        WABT_UNREACHABLE;
    }

    if (kind == CWriterPhase::Declarations) {
      Write(";", Newline());
      continue;
    }

    Write(" ");
    switch (export_->kind) {
      case ExternalKind::Func: {
        Write(OpenBrace());
        if (IsSingleUnsharedMemory()) {
          InstallSegueBase(module_->memories[0], true /* save_old_value */);
        }
        auto num_results = func_->GetNumResults();
        if (num_results > 1) {
          Write(func_->decl.sig.result_types, " ret = ");
        } else if (num_results == 1) {
          Write(func_->GetResultType(0), " ret = ");
        }
        Write(ExternalRef(ModuleFieldType::Func, internal_name), "(");

        if (IsImport(internal_name)) {
          Write("instance->",
                GlobalName(ModuleFieldType::Import,
                           import_module_sym_map_[internal_name]));
        } else {
          Write("instance");
        }
        WriteParamSymbols(index_to_name);
        if (IsSingleUnsharedMemory()) {
          RestoreSegueBase();
        }
        if (num_results > 0) {
          Write("return ret;", Newline());
        }
        Write(CloseBrace(), Newline());

        local_sym_map_.clear();
        stack_var_sym_map_.clear();
        func_ = nullptr;
        break;
      }

      case ExternalKind::Global:
        Write(OpenBrace());
        Write("return ",
              ExternalInstancePtr(ModuleFieldType::Global, internal_name), ";",
              Newline());
        Write(CloseBrace(), Newline());
        break;

      case ExternalKind::Memory:
        Write(OpenBrace());
        Write("return ",
              ExternalInstancePtr(ModuleFieldType::Memory, internal_name), ";",
              Newline());
        Write(CloseBrace(), Newline());
        break;

      case ExternalKind::Table:
        Write(OpenBrace());
        Write("return ",
              ExternalInstancePtr(ModuleFieldType::Table, internal_name), ";",
              Newline());
        Write(CloseBrace(), Newline());
        break;

      case ExternalKind::Tag:
        Write("= ", TagSymbol(internal_name), ";", Newline());
        break;

      default:
        WABT_UNREACHABLE;
    }
  }
}